

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_port.hpp
# Opt level: O0

iu_uint_max_t iutest::internal::posix::FileSize(FILE *fp)

{
  int iVar1;
  undefined1 local_a8 [8];
  StatStruct st;
  FILE *fp_local;
  
  if (fp == (FILE *)0x0) {
    fp_local = (FILE *)0x0;
  }
  else {
    st.__glibc_reserved[2] = (__syscall_slong_t)fp;
    iVar1 = Stat(fp,(StatStruct *)local_a8);
    if (iVar1 == 0) {
      fp_local = (FILE *)st.st_rdev;
    }
    else {
      fp_local = (FILE *)FileSizeBySeekSet((FILE *)st.__glibc_reserved[2]);
    }
  }
  return (iu_uint_max_t)fp_local;
}

Assistant:

inline iu_uint_max_t FileSize(FILE* fp)
{
    if( fp == NULL )
    {
        return 0;
    }
#if IUTEST_HAS_FILE_STAT
    StatStruct st;
    if (Stat(fp, &st) == 0)
    {
        return static_cast<iu_uint_max_t>(st.st_size);
    }
#endif
    return FileSizeBySeekSet(fp);
}